

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O3

edata_t * pac_alloc_real(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,size_t size,size_t alignment,
                        _Bool zero,_Bool guarded)

{
  atomic_zu_t *paVar1;
  edata_t *peVar2;
  edata_t *peVar3;
  
  peVar2 = duckdb_je_ecache_alloc
                     (tsdn,pac,ehooks,&pac->ecache_dirty,(edata_t *)0x0,size,alignment,zero,guarded)
  ;
  if ((peVar2 == (edata_t *)0x0) &&
     (((pac->decay_muzzy).time_ms.repr == 0 ||
      (peVar2 = duckdb_je_ecache_alloc
                          (tsdn,pac,ehooks,&pac->ecache_muzzy,(edata_t *)0x0,size,alignment,zero,
                           guarded), peVar2 == (edata_t *)0x0)))) {
    peVar3 = duckdb_je_ecache_alloc_grow
                       (tsdn,pac,ehooks,&pac->ecache_retained,(edata_t *)0x0,size,alignment,zero,
                        guarded);
    peVar2 = (edata_t *)0x0;
    if (peVar3 != (edata_t *)0x0) {
      LOCK();
      paVar1 = &pac->stats->pac_mapped;
      paVar1->repr = paVar1->repr + size;
      UNLOCK();
      peVar2 = peVar3;
    }
  }
  return peVar2;
}

Assistant:

static edata_t *
pac_alloc_real(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, size_t size,
    size_t alignment, bool zero, bool guarded) {
	assert(!guarded || alignment <= PAGE);

	edata_t *edata = ecache_alloc(tsdn, pac, ehooks, &pac->ecache_dirty,
	    NULL, size, alignment, zero, guarded);

	if (edata == NULL && pac_may_have_muzzy(pac)) {
		edata = ecache_alloc(tsdn, pac, ehooks, &pac->ecache_muzzy,
		    NULL, size, alignment, zero, guarded);
	}
	if (edata == NULL) {
		edata = ecache_alloc_grow(tsdn, pac, ehooks,
		    &pac->ecache_retained, NULL, size, alignment, zero,
		    guarded);
		if (config_stats && edata != NULL) {
			atomic_fetch_add_zu(&pac->stats->pac_mapped, size,
			    ATOMIC_RELAXED);
		}
	}

	return edata;
}